

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Mode __thiscall
Catch::Clara::Parser::handleMode
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  Mode MVar1;
  logic_error *this_00;
  
  switch(this->mode) {
  case None:
    if ((c == '-') && (this->inQuotes == false)) {
      MVar1 = MaybeShortOpt;
    }
    else {
      this->from = i;
      MVar1 = Positional;
    }
    break;
  case MaybeShortOpt:
    MVar1 = (c == '-') + ShortOpt;
    this->from = i + (c == '-');
    break;
  case SlashOpt:
  case ShortOpt:
  case LongOpt:
    MVar1 = handleOpt(this,i,c,arg,tokens);
    return MVar1;
  case Positional:
    MVar1 = handlePositional(this,i,c,arg,tokens);
    return MVar1;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown mode");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return MVar1;
}

Assistant:

Mode handleMode( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            switch( mode ) {
                case None: return handleNone( i, c );
                case MaybeShortOpt: return handleMaybeShortOpt( i, c );
                case ShortOpt:
                case LongOpt:
                case SlashOpt: return handleOpt( i, c, arg, tokens );
                case Positional: return handlePositional( i, c, arg, tokens );
                default: throw std::logic_error( "Unknown mode" );
            }
        }